

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::TranslateWindowsInViewport(ImGuiViewportP *viewport,ImVec2 *old_pos,ImVec2 *new_pos)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  uint uVar7;
  uint uVar8;
  ImGuiWindow *pIVar9;
  ImGuiContext *pIVar10;
  long lVar11;
  long lVar12;
  float fVar13;
  float fVar14;
  
  pIVar10 = GImGui;
  if ((viewport->Window == (ImGuiWindow *)0x0) &&
     (((viewport->super_ImGuiViewport).Flags & 0x1000) != 0)) {
    lVar11 = (long)(GImGui->Windows).Size;
    if (0 < lVar11) {
      uVar7 = GImGui->ConfigFlagsLastFrame;
      uVar8 = GImGui->ConfigFlagsCurrFrame;
      fVar1 = old_pos->x;
      fVar2 = old_pos->y;
      fVar3 = (viewport->super_ImGuiViewport).Size.x;
      fVar4 = (viewport->super_ImGuiViewport).Size.y;
      fVar13 = new_pos->x - fVar1;
      fVar14 = new_pos->y - fVar2;
      lVar12 = 0;
      do {
        if ((((uVar7 ^ uVar8) >> 10 & 1) != 0) ||
           ((((pIVar9 = (pIVar10->Windows).Data[lVar12], pIVar9->Viewport == viewport &&
              (fVar5 = (pIVar9->Pos).x, fVar1 <= fVar5)) &&
             (fVar6 = (pIVar9->Pos).y, fVar2 <= fVar6)) &&
            ((fVar5 + (pIVar9->Size).x <= fVar3 + fVar1 &&
             (fVar6 + (pIVar9->Size).y <= fVar4 + fVar2)))))) {
          pIVar9 = (pIVar10->Windows).Data[lVar12];
          (pIVar9->Pos).x = (pIVar9->Pos).x + fVar13;
          (pIVar9->Pos).y = (pIVar9->Pos).y + fVar14;
          (pIVar9->ClipRect).Min.x = (pIVar9->ClipRect).Min.x + fVar13;
          (pIVar9->ClipRect).Min.y = (pIVar9->ClipRect).Min.y + fVar14;
          (pIVar9->ClipRect).Max.x = (pIVar9->ClipRect).Max.x + fVar13;
          (pIVar9->ClipRect).Max.y = (pIVar9->ClipRect).Max.y + fVar14;
          (pIVar9->OuterRectClipped).Min.x = (pIVar9->OuterRectClipped).Min.x + fVar13;
          (pIVar9->OuterRectClipped).Min.y = (pIVar9->OuterRectClipped).Min.y + fVar14;
          (pIVar9->OuterRectClipped).Max.x = (pIVar9->OuterRectClipped).Max.x + fVar13;
          (pIVar9->OuterRectClipped).Max.y = (pIVar9->OuterRectClipped).Max.y + fVar14;
          (pIVar9->InnerRect).Min.x = (pIVar9->InnerRect).Min.x + fVar13;
          (pIVar9->InnerRect).Min.y = (pIVar9->InnerRect).Min.y + fVar14;
          (pIVar9->InnerRect).Max.x = (pIVar9->InnerRect).Max.x + fVar13;
          (pIVar9->InnerRect).Max.y = (pIVar9->InnerRect).Max.y + fVar14;
          (pIVar9->DC).CursorPos.x = (pIVar9->DC).CursorPos.x + fVar13;
          (pIVar9->DC).CursorPos.y = (pIVar9->DC).CursorPos.y + fVar14;
          (pIVar9->DC).CursorStartPos.x = (pIVar9->DC).CursorStartPos.x + fVar13;
          (pIVar9->DC).CursorStartPos.y = (pIVar9->DC).CursorStartPos.y + fVar14;
          (pIVar9->DC).CursorMaxPos.x = (pIVar9->DC).CursorMaxPos.x + fVar13;
          (pIVar9->DC).CursorMaxPos.y = (pIVar9->DC).CursorMaxPos.y + fVar14;
        }
        lVar12 = lVar12 + 1;
      } while (lVar11 != lVar12);
    }
    return;
  }
  __assert_fail("viewport->Window == __null && (viewport->Flags & ImGuiViewportFlags_CanHostOtherWindows)"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                ,0x2e11,
                "void ImGui::TranslateWindowsInViewport(ImGuiViewportP *, const ImVec2 &, const ImVec2 &)"
               );
}

Assistant:

void ImGui::TranslateWindowsInViewport(ImGuiViewportP* viewport, const ImVec2& old_pos, const ImVec2& new_pos)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(viewport->Window == NULL && (viewport->Flags & ImGuiViewportFlags_CanHostOtherWindows));

    // 1) We test if ImGuiConfigFlags_ViewportsEnable was just toggled, which allows us to conveniently
    // translate imgui windows from OS-window-local to absolute coordinates or vice-versa.
    // 2) If it's not going to fit into the new size, keep it at same absolute position.
    // One problem with this is that most Win32 applications doesn't update their render while dragging,
    // and so the window will appear to teleport when releasing the mouse.
    const bool translate_all_windows = (g.ConfigFlagsCurrFrame & ImGuiConfigFlags_ViewportsEnable) != (g.ConfigFlagsLastFrame & ImGuiConfigFlags_ViewportsEnable);
    ImRect test_still_fit_rect(old_pos, old_pos + viewport->Size);
    ImVec2 delta_pos = new_pos - old_pos;
    for (int window_n = 0; window_n < g.Windows.Size; window_n++) // FIXME-OPT
        if (translate_all_windows || (g.Windows[window_n]->Viewport == viewport && test_still_fit_rect.Contains(g.Windows[window_n]->Rect())))
            TranslateWindow(g.Windows[window_n], delta_pos);
}